

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O3

int read_double(coda_cursor *cursor,double *dst)

{
  coda_backend cVar1;
  int iVar2;
  coda_type *pcVar3;
  coda_type *pcVar4;
  double dVar5;
  int32_t scale_factor;
  coda_cursor expr_cursor;
  int local_33c;
  double local_338;
  coda_cursor local_330;
  
  pcVar4 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  cVar1 = pcVar4->format;
  pcVar3 = pcVar4;
  if (99 < cVar1) {
    pcVar3 = *(coda_type **)&pcVar4->type_class;
  }
  if (pcVar3->type_class == 6) {
    if (pcVar3[1].format == 1) {
      memcpy(&local_330,cursor,0x310);
      iVar2 = coda_cursor_use_base_type_of_special_type(&local_330);
      if (iVar2 != 0) {
        return -1;
      }
      iVar2 = coda_cursor_goto_first_record_field(&local_330);
      if (iVar2 != 0) {
        return -1;
      }
      iVar2 = coda_cursor_read_int32(&local_330,&local_33c);
      if (iVar2 != 0) {
        return -1;
      }
      iVar2 = coda_cursor_goto_next_record_field(&local_330);
      if (iVar2 != 0) {
        return -1;
      }
      iVar2 = coda_cursor_read_double(&local_330,&local_338);
      if (iVar2 != 0) {
        return -1;
      }
      if (local_33c < 1) {
        dVar5 = 1.0;
        for (; local_33c != 0; local_33c = local_33c + 1) {
          dVar5 = dVar5 * 10.0;
        }
      }
      else {
        dVar5 = 1.0;
        do {
          dVar5 = dVar5 * 10.0;
          local_33c = local_33c + -1;
        } while (local_33c != 0);
        dVar5 = 1.0 / dVar5;
      }
      *dst = local_338 * dVar5;
      return 0;
    }
    if (pcVar3[1].format == 2) {
      memcpy(&local_330,cursor,0x310);
      if (99 < cVar1) {
        pcVar4 = *(coda_type **)&pcVar4->type_class;
      }
      iVar2 = coda_cursor_use_base_type_of_special_type(&local_330);
      if (iVar2 != 0) {
        return -1;
      }
      iVar2 = coda_expression_eval_float(*(coda_expression **)((long)pcVar4 + 0x50),&local_330,dst);
      return iVar2;
    }
  }
  switch(cVar1) {
  case coda_backend_memory:
    iVar2 = coda_mem_cursor_read_double(cursor,dst);
    return iVar2;
  case coda_backend_hdf4:
    iVar2 = -0xb;
    break;
  case coda_backend_hdf5:
    iVar2 = -0xd;
    break;
  case coda_backend_cdf:
    iVar2 = coda_cdf_cursor_read_double(cursor,dst);
    return iVar2;
  case coda_backend_netcdf:
    iVar2 = coda_netcdf_cursor_read_double(cursor,dst);
    return iVar2;
  default:
    if (cVar1 == coda_backend_binary) {
      iVar2 = coda_bin_cursor_read_double(cursor,dst);
      return iVar2;
    }
    if (cVar1 != coda_backend_ascii) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                    ,0x2b4,"int read_double(const coda_cursor *, double *)");
    }
    iVar2 = coda_ascii_cursor_read_double(cursor,dst);
    return iVar2;
  }
  coda_set_error(iVar2,(char *)0x0);
  return -1;
}

Assistant:

static int read_double(const coda_cursor *cursor, double *dst)
{
    coda_type *type;

    type = (coda_type *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class == coda_special_class)
    {
        if (((coda_type_special *)type)->special_type == coda_special_time)
        {
            return read_time(cursor, dst);
        }
        if (((coda_type_special *)type)->special_type == coda_special_vsf_integer)
        {
            return read_vsf_integer(cursor, dst);
        }
    }
    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            return coda_ascii_cursor_read_double(cursor, dst);
        case coda_backend_binary:
            return coda_bin_cursor_read_double(cursor, dst);
        case coda_backend_memory:
            return coda_mem_cursor_read_double(cursor, dst);
        case coda_backend_hdf4:
#ifdef HAVE_HDF4
            return coda_hdf4_cursor_read_double(cursor, dst);
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_hdf5:
#ifdef HAVE_HDF5
            return coda_hdf5_cursor_read_double(cursor, dst);
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_cdf:
            return coda_cdf_cursor_read_double(cursor, dst);
        case coda_backend_netcdf:
            return coda_netcdf_cursor_read_double(cursor, dst);
        case coda_backend_grib:
            break;
    }

    assert(0);
    exit(1);
}